

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

bool __thiscall iutest::detail::RegexMatcher::Regex(RegexMatcher *this,string *actual)

{
  char *pcVar1;
  bool local_21;
  string *actual_local;
  RegexMatcher *this_local;
  
  if ((this->m_full_match & 1U) == 0) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    local_21 = iuRegex::PartialMatch(&this->m_expected,pcVar1);
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    local_21 = iuRegex::FullMatch(&this->m_expected,pcVar1);
  }
  return local_21;
}

Assistant:

bool Regex(const ::std::string& actual) const
    {
        return m_full_match ? m_expected.FullMatch(actual.c_str())
            : m_expected.PartialMatch(actual.c_str());
    }